

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

Var Js::JavascriptOperators::BoxStackInstance
              (Var instance,ScriptContext *scriptContext,bool allowStackFunction,bool deepCopy)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  undefined4 *puVar4;
  RecyclableObject *this;
  JavascriptRegExp *instance_00;
  DynamicObject *instance_01;
  JavascriptArray *instance_02;
  JavascriptNativeIntArray *instance_03;
  JavascriptNativeFloatArray *instance_04;
  TypeId typeId;
  bool deepCopy_local;
  bool allowStackFunction_local;
  ScriptContext *scriptContext_local;
  Var instance_local;
  TypeId local_18;
  TypeId typeId_1;
  
  bVar2 = ThreadContext::IsOnStack(instance);
  instance_local = instance;
  if ((bVar2) &&
     (((!allowStackFunction || (bVar2 = TaggedNumber::Is(instance), bVar2)) ||
      ((*instance & 1) == 0)))) {
    if (instance == (Var)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    bVar2 = TaggedInt::Is(instance);
    if (bVar2) {
      local_18 = TypeIds_FirstNumberType;
    }
    else {
      bVar2 = JavascriptNumber::Is_NoTaggedIntCheck(instance);
      if (bVar2) {
        local_18 = TypeIds_Number;
      }
      else {
        this = UnsafeVarTo<Js::RecyclableObject>(instance);
        if (this == (RecyclableObject *)0x0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar4 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                      ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar4 = 0;
        }
        local_18 = RecyclableObject::GetTypeId(this);
        if ((0x57 < (int)local_18) && (BVar3 = RecyclableObject::IsExternal(this), BVar3 == 0)) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar4 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                      ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                      "GetTypeId aValue has invalid TypeId");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar4 = 0;
        }
      }
    }
    switch(local_18) {
    case TypeIds_FirstNumberType:
    case TypeIds_Number:
      break;
    case TypeIds_Function:
      if (!allowStackFunction) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                    ,0x289f,"(allowStackFunction)","allowStackFunction");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 0;
      }
      break;
    case TypeIds_Object:
      instance_01 = VarTo<Js::DynamicObject>(instance);
      instance_local = DynamicObject::BoxStackInstance(instance_01,deepCopy);
      break;
    case TypeIds_Array:
      instance_02 = UnsafeVarTo<Js::JavascriptArray>(instance);
      instance_local = Js::JavascriptArray::BoxStackInstance(instance_02,deepCopy);
      break;
    case TypeIds_NativeIntArray:
      instance_03 = UnsafeVarTo<Js::JavascriptNativeIntArray>(instance);
      instance_local = JavascriptNativeIntArray::BoxStackInstance(instance_03,deepCopy);
      break;
    case TypeIds_CopyOnAccessNativeIntArray:
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                  ,0x28a5,"(false)","false");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    default:
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                  ,0x28a9,"(false)","false");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
      break;
    case TypeIds_ArrayLast:
      instance_04 = UnsafeVarTo<Js::JavascriptNativeFloatArray>(instance);
      instance_local = JavascriptNativeFloatArray::BoxStackInstance(instance_04,deepCopy);
      break;
    case TypeIds_RegEx:
      instance_00 = VarTo<Js::JavascriptRegExp>(instance);
      instance_local = JavascriptRegExp::BoxStackInstance(instance_00,deepCopy);
    }
  }
  return instance_local;
}

Assistant:

Js::Var
    JavascriptOperators::BoxStackInstance(Js::Var instance, ScriptContext * scriptContext, bool allowStackFunction, bool deepCopy)
    {
        if (!ThreadContext::IsOnStack(instance) || (allowStackFunction && !TaggedNumber::Is(instance) && (*(int*)instance & 1)))
        {
            return instance;
        }

        TypeId typeId = JavascriptOperators::GetTypeId(instance);
        switch (typeId)
        {
        case Js::TypeIds_Number:
#if !FLOATVAR
            return JavascriptNumber::BoxStackInstance(instance, scriptContext);
#endif
            // fall-through
        case Js::TypeIds_Integer:
            return instance;
        case Js::TypeIds_RegEx:
            return JavascriptRegExp::BoxStackInstance(VarTo<JavascriptRegExp>(instance), deepCopy);
        case Js::TypeIds_Object:
            return DynamicObject::BoxStackInstance(VarTo<DynamicObject>(instance), deepCopy);
        case Js::TypeIds_Array:
            return JavascriptArray::BoxStackInstance(UnsafeVarTo<JavascriptArray>(instance), deepCopy);
        case Js::TypeIds_NativeIntArray:
            return JavascriptNativeIntArray::BoxStackInstance(UnsafeVarTo<JavascriptNativeIntArray>(instance), deepCopy);
        case Js::TypeIds_NativeFloatArray:
            return JavascriptNativeFloatArray::BoxStackInstance(UnsafeVarTo<JavascriptNativeFloatArray>(instance), deepCopy);
        case Js::TypeIds_Function:
            Assert(allowStackFunction);
            // Stack functions are deal with not mar mark them, but by nested function escape analysis
            // in the front end.  No need to box here.
            return instance;
#if ENABLE_COPYONACCESS_ARRAY
        case Js::TypeIds_CopyOnAccessNativeIntArray:
            Assert(false);
            // fall-through
#endif
        default:
            Assert(false);
            return instance;
        };
    }